

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O0

void __thiscall r_code::LObject::add_reference(LObject *this,Code *object)

{
  P<r_code::Code> local_20;
  Code *local_18;
  Code *object_local;
  LObject *this_local;
  
  local_18 = object;
  object_local = &this->super_Code;
  core::P<r_code::Code>::P(&local_20,object);
  vector<core::P<r_code::Code>_>::push_back(&this->_references,&local_20);
  core::P<r_code::Code>::~P(&local_20);
  return;
}

Assistant:

void add_reference(Code *object)
    {
        _references.push_back(object);
    }